

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O0

int PARMCI_Init_mpi_comm(MPI_Comm comm)

{
  int iVar1;
  MPI_Comm *in_RDI;
  comex_group_t unaff_retaddr;
  int rc;
  int ret;
  MPI_Comm in_stack_00000140;
  int local_c;
  
  iVar1 = comex_init_comm((MPI_Comm)0x1cebc3);
  if (iVar1 == 0) {
    iVar1 = comex_group_comm(unaff_retaddr,in_RDI);
    if (iVar1 != 0) {
      __assert_fail("COMEX_SUCCESS == rc",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/armci.c"
                    ,0x1b0,"int PARMCI_Init_mpi_comm(MPI_Comm)");
    }
    ARMCI_Default_Proc_Group = 0;
    armci_init_domains(in_stack_00000140);
    local_c = 1;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

int PARMCI_Init_mpi_comm(MPI_Comm comm)
{
    int ret = comex_init_comm(comm);
    if (ret == COMEX_SUCCESS) {
      int rc = comex_group_comm(COMEX_GROUP_WORLD, &ARMCI_COMM_WORLD);
      assert(COMEX_SUCCESS == rc);
      ARMCI_Default_Proc_Group = 0;
      armci_init_domains(ARMCI_COMM_WORLD);
      ret = 1;
    } else {
      ret = 0;
    }
    return ret;
}